

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

int __thiscall
glslang::TIntermediate::checkLocationRange
          (TIntermediate *this,int set,TIoRange *range,TType *type,bool *typeCollision)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer pTVar4;
  ulong uVar5;
  pointer pTVar6;
  int *piVar7;
  vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_> *pvVar8;
  long lVar9;
  _Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_> *p_Var10;
  
  pTVar6 = this->usedIo[set].
           super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->usedIo[set].super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>.
      _M_impl.super__Vector_impl_data._M_finish != pTVar6) {
    p_Var10 = &this->usedIo[set].
               super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>;
    lVar9 = 0;
    uVar5 = 0;
    do {
      bVar1 = TIoRange::overlap(range,(TIoRange *)((long)&(pTVar6->location).start + lVar9));
      pTVar6 = (p_Var10->_M_impl).super__Vector_impl_data._M_start;
      if (bVar1) {
LAB_003f59e7:
        piVar7 = (int *)((long)&(pTVar6->location).start + lVar9);
        goto LAB_003f59ea;
      }
      if ((*(int *)((long)&(pTVar6->location).start + lVar9) <= (range->location).last) &&
         ((range->location).start <= *(int *)((long)&(pTVar6->location).last + lVar9))) {
        iVar2 = (*type->_vptr_TType[7])(type);
        pTVar6 = (p_Var10->_M_impl).super__Vector_impl_data._M_start;
        iVar3 = *(int *)((long)&pTVar6->basicType + lVar9);
        if ((((((iVar2 == iVar3) || ((iVar2 == 4 && (iVar3 == 5)))) ||
              ((iVar2 == 5 && (iVar3 == 4)))) ||
             ((((iVar2 == 6 && (iVar3 == 7)) || ((iVar2 == 7 && (iVar3 == 6)))) ||
              ((iVar2 == 8 && (iVar3 == 9)))))) || ((iVar2 == 9 && (iVar3 == 8)))) ||
           (((iVar2 == 10 && (iVar3 == 0xb)) || ((iVar2 == 0xb && (iVar3 == 10)))))) {
          iVar3 = (*type->_vptr_TType[0xb])(type);
          pTVar6 = (p_Var10->_M_impl).super__Vector_impl_data._M_start;
          if ((*(uint *)(CONCAT44(extraout_var,iVar3) + 8) >> 0x1d & 1) ==
              (uint)(&pTVar6->centroid)[lVar9]) {
            iVar3 = (*type->_vptr_TType[0xb])(type);
            pTVar6 = (p_Var10->_M_impl).super__Vector_impl_data._M_start;
            if ((*(uint *)(CONCAT44(extraout_var_00,iVar3) + 8) >> 0x1e & 1) ==
                (uint)(&pTVar6->smooth)[lVar9]) {
              iVar3 = (*type->_vptr_TType[0xb])(type);
              pTVar6 = (p_Var10->_M_impl).super__Vector_impl_data._M_start;
              if (SUB41((uint)*(undefined4 *)(CONCAT44(extraout_var_01,iVar3) + 8) >> 0x1f,0) ==
                  (&pTVar6->flat)[lVar9]) {
                iVar3 = (*type->_vptr_TType[0xb])(type);
                pTVar6 = (p_Var10->_M_impl).super__Vector_impl_data._M_start;
                if (((uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_02,iVar3) + 8) >> 0x2d) & 1
                    ) == (uint)(&pTVar6->sample)[lVar9]) {
                  iVar3 = (*type->_vptr_TType[0xb])(type);
                  pTVar6 = (p_Var10->_M_impl).super__Vector_impl_data._M_start;
                  if (((uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_03,iVar3) + 8) >> 0x2c) &
                      1) == (uint)(&pTVar6->patch)[lVar9]) goto LAB_003f5943;
                }
              }
            }
          }
        }
        *typeCollision = true;
        goto LAB_003f59e7;
      }
LAB_003f5943:
      uVar5 = uVar5 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar5 < (ulong)((long)this->usedIo[set].
                                   super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar6 >> 5));
  }
  if ((set == 4) || (set == 1)) {
    pvVar8 = this->usedIo + 1;
    if (set != 4) {
      pvVar8 = this->usedIo + 4;
    }
    pTVar6 = (pvVar8->super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pTVar4 = (pvVar8->super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar4 != pTVar6) {
      lVar9 = 0;
      uVar5 = 0;
      do {
        if ((*(int *)((long)&(pTVar6->location).start + lVar9) <= (range->location).last) &&
           ((range->location).start <= *(int *)((long)&(pTVar6->location).last + lVar9))) {
          iVar3 = (*type->_vptr_TType[7])(type);
          pTVar6 = (pvVar8->
                   super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (iVar3 != *(int *)((long)&pTVar6->basicType + lVar9)) {
            *typeCollision = true;
            piVar7 = (int *)((long)&(pTVar6->location).start + lVar9);
LAB_003f59ea:
            iVar3 = (range->location).start;
            if (iVar3 <= *piVar7) {
              return *piVar7;
            }
            return iVar3;
          }
          pTVar4 = (pvVar8->
                   super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar5 = uVar5 + 1;
        lVar9 = lVar9 + 0x20;
      } while (uVar5 < (ulong)((long)pTVar4 - (long)pTVar6 >> 5));
    }
  }
  return -1;
}

Assistant:

int TIntermediate::checkLocationRange(int set, const TIoRange& range, const TType& type, bool& typeCollision)
{
    for (size_t r = 0; r < usedIo[set].size(); ++r) {
        if (range.overlap(usedIo[set][r])) {
            // there is a collision; pick one
            return std::max(range.location.start, usedIo[set][r].location.start);
        } else if (range.location.overlap(usedIo[set][r].location) &&
                   (!checkCompatibleTypes(type.getBasicType(), usedIo[set][r].basicType) ||
                    type.getQualifier().centroid != usedIo[set][r].centroid ||
                    type.getQualifier().smooth != usedIo[set][r].smooth ||
                    type.getQualifier().flat != usedIo[set][r].flat ||
                    type.getQualifier().sample != usedIo[set][r].sample ||
                    type.getQualifier().patch != usedIo[set][r].patch)) {
            // aliased-type mismatch
            typeCollision = true;
            return std::max(range.location.start, usedIo[set][r].location.start);
        }
    }

    // check typeCollision between tileImageEXT and out
    if (set == 4 || set == 1) {
      // if the set is "tileImageEXT", check against "out" and vice versa
      int againstSet = (set == 4) ? 1 : 4;
      for (size_t r = 0; r < usedIo[againstSet].size(); ++r) {
        if (range.location.overlap(usedIo[againstSet][r].location) && type.getBasicType() != usedIo[againstSet][r].basicType) {
            // aliased-type mismatch
            typeCollision = true;
            return std::max(range.location.start, usedIo[againstSet][r].location.start);
        }
      }
    }

    return -1; // no collision
}